

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_crossed(chunk_conflict *c,loc centre,wchar_t rating)

{
  int iVar1;
  wchar_t wVar2;
  _Bool _Var3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  wchar_t y1;
  wchar_t y2;
  wchar_t x2;
  wchar_t x1;
  wchar_t y2_00;
  wchar_t x2_00;
  loc lVar7;
  int local_94;
  int local_90;
  wchar_t local_68;
  wchar_t light;
  wchar_t wx;
  wchar_t wy;
  wchar_t dx;
  wchar_t dy;
  wchar_t x2b;
  wchar_t y2b;
  wchar_t x1b;
  wchar_t y1b;
  wchar_t x2a;
  wchar_t y2a;
  wchar_t x1a;
  wchar_t y1a;
  wchar_t width;
  wchar_t height;
  wchar_t x;
  wchar_t y;
  wchar_t rating_local;
  chunk_conflict *c_local;
  wchar_t wStack_10;
  loc centre_local;
  
  iVar5 = c->depth;
  unique0x100003f0 = centre;
  uVar4 = Rand_div(0x19);
  local_68 = (wchar_t)(iVar5 <= (int)(uVar4 + 1));
  iVar5 = rand_range(3,4);
  iVar6 = rand_range(3,0xb);
  if (iVar5 * 2 + 1 < 3) {
    local_90 = 3;
  }
  else {
    local_90 = iVar5 * 2 + 1;
  }
  if (iVar6 * 2 + 1 < 4) {
    local_94 = 3;
  }
  else {
    local_94 = iVar6 * 2 + 1;
  }
  event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_90 + L'\x02',local_94 + L'\x02');
  if (((wStack_10 < c->height) && (c_local._4_4_ < c->width)) ||
     (_Var3 = find_space((loc *)((long)&c_local + 4),local_90 + L'\x02',local_94 + L'\x02'), _Var3))
  {
    wVar2 = wStack_10;
    y1 = wStack_10 - iVar5;
    iVar1 = c_local._4_4_;
    width = c_local._4_4_ + L'\xffffffff';
    y2 = wStack_10 + iVar5;
    x2 = c_local._4_4_ + L'\x01';
    height = wStack_10 + L'\xffffffff';
    x1 = c_local._4_4_ - iVar6;
    y2_00 = wStack_10 + L'\x01';
    x2_00 = c_local._4_4_ + iVar6;
    generate_room(c,y1 + L'\xffffffff',c_local._4_4_ + L'\xfffffffe',y2 + L'\x01',
                  c_local._4_4_ + L'\x02',local_68);
    generate_room(c,wVar2 + L'\xfffffffe',x1 + L'\xffffffff',wVar2 + L'\x02',x2_00 + L'\x01',
                  local_68);
    draw_rectangle(c,y1 + L'\xffffffff',iVar1 + L'\xfffffffe',y2 + L'\x01',iVar1 + L'\x02',L'\x15',
                   L'\f',false);
    draw_rectangle(c,wVar2 + L'\xfffffffe',x1 + L'\xffffffff',wVar2 + L'\x02',x2_00 + L'\x01',
                   L'\x15',L'\f',false);
    fill_rectangle(c,y1,width,y2,x2,L'\x01',L'\0');
    fill_rectangle(c,height,x1,y2_00,x2_00,L'\x01',L'\0');
    uVar4 = Rand_div(4);
    switch(uVar4) {
    case 0:
      break;
    case 1:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"solid middle");
      fill_rectangle(c,height,width,y2_00,x2,L'\x15',L'\v');
      break;
    case 2:
      event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"inner vault");
      draw_rectangle(c,height,width,y2_00,x2,L'\x15',L'\v',false);
      generate_hole(c,height,width,y2_00,x2,L'\x0f');
      place_object(c,stack0xffffffffffffffec,c->depth,false,false,'\x03',L'\0');
      iVar5 = c->depth;
      uVar4 = Rand_div(2);
      vault_monsters(c,stack0xffffffffffffffec,iVar5 + L'\x02',uVar4 + L'\x03');
      uVar4 = Rand_div(3);
      vault_traps(c,stack0xffffffffffffffec,L'\x04',L'\x04',uVar4 + L'\x02');
      break;
    case 3:
      uVar4 = Rand_div(3);
      if (uVar4 == 0) {
        event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pinched");
        for (; height <= y2_00; height = height + L'\x01') {
          if (height != wStack_10) {
            lVar7 = loc(iVar1 + -2,height);
            set_marked_granite(c,lVar7,L'\v');
            lVar7 = loc(iVar1 + 2,height);
            set_marked_granite(c,lVar7,L'\v');
          }
        }
        for (; width <= x2; width = width + L'\x01') {
          if (width != c_local._4_4_) {
            lVar7 = loc(width,wVar2 + -2);
            set_marked_granite(c,lVar7,L'\v');
            lVar7 = loc(width,wVar2 + 2);
            set_marked_granite(c,lVar7,L'\v');
          }
        }
        uVar4 = Rand_div(3);
        if (uVar4 == 0) {
          generate_open(c,wVar2 + L'\xfffffffe',iVar1 + L'\xfffffffe',wVar2 + L'\x02',
                        iVar1 + L'\x02',L'\x02');
        }
      }
      else {
        uVar4 = Rand_div(3);
        if (uVar4 == 0) {
          event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"plus");
          generate_plus(c,height,width,y2_00,x2,L'\x15',L'\v');
        }
        else {
          uVar4 = Rand_div(3);
          if (uVar4 == 0) {
            event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"pillar");
            set_marked_granite(c,stack0xffffffffffffffec,L'\v');
          }
        }
      }
    }
    centre_local.x._3_1_ = true;
  }
  else {
    centre_local.x._3_1_ = false;
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_crossed(struct chunk *c, struct loc centre, int rating)
{
	int y, x;
	int height, width;

	int y1a, x1a, y2a, x2a;
	int y1b, x1b, y2b, x2b;

	int dy, dx, wy, wx;

	int light = false;

	/* Occasional light */
	if (c->depth <= randint1(25)) light = true;

	/* Pick inner dimension */
	wy = 1;
	wx = 1;

	/* Pick outer dimension */
	dy = rand_range(3, 4);
	dx = rand_range(3, 11);

	/* Determine extents of room (a) */
	y1a = dy;
	x1a = wx;
	y2a = dy;
	x2a = wx;

	/* Determine extents of room (b) */
	y1b = wy;
	x1b = dx;
	y2b = wy;
	x2b = dx;

	/* Calculate height and width */
	height = MAX(y1a + y2a + 1, y1b + y2b + 1);
	width = MAX(x1a + x2a + 1, x1b + x2b + 1);

	/* Find and reserve some space in the dungeon.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height + 2, width + 2);
	if (centre.y >= c->height || centre.x >= c->width) {
		if (!find_space(&centre, height + 2, width + 2))
			return (false);
	}

	/* locate room (b) */
	y1a = centre.y - dy;
	x1a = centre.x - wx;
	y2a = centre.y + dy;
	x2a = centre.x + wx;

	/* locate room (b) */
	y1b = centre.y - wy;
	x1b = centre.x - dx;
	y2b = centre.y + wy;
	x2b = centre.x + dx;

	/* Generate new room (a) */
	generate_room(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, light);

	/* Generate new room (b) */
	generate_room(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, light);

	/* Generate outer walls (a) */
	draw_rectangle(c, y1a - 1, x1a - 1, y2a + 1, x2a + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate outer walls (b) */
	draw_rectangle(c, y1b - 1, x1b - 1, y2b + 1, x2b + 1, 
		FEAT_GRANITE, SQUARE_WALL_OUTER, false);

	/* Generate inner floors (a) */
	fill_rectangle(c, y1a, x1a, y2a, x2a, FEAT_FLOOR, SQUARE_NONE);

	/* Generate inner floors (b) */
	fill_rectangle(c, y1b, x1b, y2b, x2b, FEAT_FLOOR, SQUARE_NONE);

	/* Special features */
	switch (randint1(4)) {
		/* Nothing */
	case 1: break;

		/* Large solid middle pillar */
	case 2: {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"solid middle");
		fill_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE, SQUARE_WALL_INNER);
		break;
	}

		/* Inner treasure vault */
	case 3: {
		/* Generate a small inner vault */
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
			"inner vault");
		draw_rectangle(c, y1b, x1a, y2b, x2a, FEAT_GRANITE,
			SQUARE_WALL_INNER, false);

		/* Open the inner vault with a secret door */
		generate_hole(c, y1b, x1a, y2b, x2a, FEAT_SECRET);

		/* Place a treasure in the vault */
		place_object(c, centre, c->depth, false, false, ORIGIN_SPECIAL, 0);

		/* Let's guard the treasure well */
		vault_monsters(c, centre, c->depth + 2, randint0(2) + 3);

		/* Traps naturally */
		vault_traps(c, centre, 4, 4, randint0(3) + 2);

		break;
	}

		/* Something else */
	case 4: {
		if (one_in_(3)) {
			/* Occasionally pinch the center shut */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pinched");

			/* Pinch the east/west sides */
			for (y = y1b; y <= y2b; y++) {
				if (y == centre.y) continue;
				set_marked_granite(c, loc(x1a - 1, y), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x2a + 1, y), SQUARE_WALL_INNER);
			}

			/* Pinch the north/south sides */
			for (x = x1a; x <= x2a; x++) {
				if (x == centre.x) continue;
				set_marked_granite(c, loc(x, y1b - 1), SQUARE_WALL_INNER);
				set_marked_granite(c, loc(x, y2b + 1), SQUARE_WALL_INNER);
			}

			/* Open sides with doors */
			if (one_in_(3))
				generate_open(c, y1b - 1, x1a - 1, y2b + 1, x2a + 1,
							  FEAT_CLOSED);

		} else if (one_in_(3)) {
			/* Occasionally put a "plus" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"plus");
			generate_plus(c, y1b, x1a, y2b, x2a, 
						  FEAT_GRANITE, SQUARE_WALL_INNER);

		} else if (one_in_(3)) {
			/* Occasionally put a "pillar" in the center */
			event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,
				"pillar");
			set_marked_granite(c, centre, SQUARE_WALL_INNER);
		}

		break;
	}
	}

	return true;
}